

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorPool::FindAllExtensions
          (DescriptorPool *this,Descriptor *extendee,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *out)

{
  pointer *pppFVar1;
  Tables *pTVar2;
  iterator __position;
  Descriptor *pDVar3;
  int iVar4;
  size_type sVar5;
  iterator iVar6;
  _Rb_tree_node_base *p_Var7;
  _Rb_tree_node_base *p_Var8;
  long lVar9;
  ulong uVar10;
  _Rb_tree_header *p_Var11;
  _Rb_tree_node_base *p_Var12;
  vector<int,_std::allocator<int>_> numbers;
  MutexLockMaybe lock;
  __node_gen_type __node_gen;
  Descriptor *local_70;
  void *local_68;
  void *pvStack_60;
  long local_58;
  MutexLockMaybe local_48;
  key_type local_40;
  
  local_48.mu_ = this->mutex_;
  local_70 = extendee;
  if (local_48.mu_ != (Mutex *)0x0) {
    internal::Mutex::Lock(local_48.mu_);
  }
  pTVar2 = (this->tables_).ptr_;
  if (pTVar2 != (Tables *)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             *)&pTVar2->known_bad_symbols_);
    pTVar2 = (this->tables_).ptr_;
    if (pTVar2 != (Tables *)0x0) {
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)&pTVar2->known_bad_files_);
      if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
        pTVar2 = (this->tables_).ptr_;
        if (pTVar2 == (Tables *)0x0) goto LAB_002d598e;
        sVar5 = std::
                _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::count((_Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)&pTVar2->extensions_loaded_from_db_,&local_70);
        if (sVar5 == 0) {
          local_68 = (void *)0x0;
          pvStack_60 = (void *)0x0;
          local_58 = 0;
          iVar4 = (*this->fallback_database_->_vptr_DescriptorDatabase[5])
                            (this->fallback_database_,*(undefined8 *)(local_70 + 8));
          if ((char)iVar4 != '\0') {
            if (pvStack_60 != local_68) {
              uVar10 = 0;
              do {
                pTVar2 = (this->tables_).ptr_;
                if (pTVar2 == (Tables *)0x0) goto LAB_002d598e;
                iVar4 = *(int *)((long)local_68 + uVar10 * 4);
                local_40.first = local_70;
                local_40.second = iVar4;
                iVar6 = std::
                        _Rb_tree<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
                        ::find(&(pTVar2->extensions_)._M_t,&local_40);
                if (((_Rb_tree_header *)iVar6._M_node ==
                     &(pTVar2->extensions_)._M_t._M_impl.super__Rb_tree_header) ||
                   (iVar6._M_node[1]._M_left == (_Base_ptr)0x0)) {
                  TryFindExtensionInFallbackDatabase(this,local_70,iVar4);
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 < (ulong)((long)pvStack_60 - (long)local_68 >> 2));
            }
            pTVar2 = (this->tables_).ptr_;
            if (pTVar2 == (Tables *)0x0) goto LAB_002d598e;
            local_40.first = (Descriptor *)&pTVar2->extensions_loaded_from_db_;
            std::
            _Hashtable<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>,std::__detail::_Identity,std::equal_to<google::protobuf::Descriptor_const*>,google::protobuf::hash<google::protobuf::Descriptor_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<google::protobuf::Descriptor_const*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<google::protobuf::Descriptor_const*,true>>>>
                      ((_Hashtable<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>,std::__detail::_Identity,std::equal_to<google::protobuf::Descriptor_const*>,google::protobuf::hash<google::protobuf::Descriptor_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)local_40.first,&local_70);
          }
          if (local_68 != (void *)0x0) {
            operator_delete(local_68,local_58 - (long)local_68);
          }
        }
      }
      pDVar3 = local_70;
      pTVar2 = (this->tables_).ptr_;
      if (pTVar2 != (Tables *)0x0) {
        p_Var7 = (pTVar2->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (p_Var7 != (_Rb_tree_node_base *)0x0) {
          p_Var11 = &(pTVar2->extensions_)._M_t._M_impl.super__Rb_tree_header;
          p_Var12 = &p_Var11->_M_header;
          do {
            if ((*(Descriptor **)(p_Var7 + 1) < local_70) ||
               ((lVar9 = 0x10, p_Var8 = p_Var7, *(Descriptor **)(p_Var7 + 1) <= local_70 &&
                (*(int *)&p_Var7[1]._M_parent < 0)))) {
              lVar9 = 0x18;
              p_Var8 = p_Var12;
            }
            p_Var7 = *(_Rb_tree_node_base **)((long)&p_Var7->_M_color + lVar9);
            p_Var12 = p_Var8;
          } while (p_Var7 != (_Rb_tree_node_base *)0x0);
          for (; ((_Rb_tree_header *)p_Var8 != p_Var11 && (*(Descriptor **)(p_Var8 + 1) == pDVar3));
              p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
            __position._M_current =
                 (out->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (out->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                        ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                          *)out,__position,(FieldDescriptor **)&p_Var8[1]._M_left);
            }
            else {
              *__position._M_current = (FieldDescriptor *)p_Var8[1]._M_left;
              pppFVar1 = &(out->
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
              *pppFVar1 = *pppFVar1 + 1;
            }
          }
        }
        if (this->underlay_ != (DescriptorPool *)0x0) {
          FindAllExtensions(this->underlay_,local_70,out);
        }
        internal::MutexLockMaybe::~MutexLockMaybe(&local_48);
        return;
      }
    }
  }
LAB_002d598e:
  __assert_fail("ptr_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                ,0x5f,
                "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
               );
}

Assistant:

void DescriptorPool::FindAllExtensions(
    const Descriptor* extendee,
    std::vector<const FieldDescriptor*>* out) const {
  MutexLockMaybe lock(mutex_);
  tables_->known_bad_symbols_.clear();
  tables_->known_bad_files_.clear();

  // Initialize tables_->extensions_ from the fallback database first
  // (but do this only once per descriptor).
  if (fallback_database_ != NULL &&
      tables_->extensions_loaded_from_db_.count(extendee) == 0) {
    std::vector<int> numbers;
    if (fallback_database_->FindAllExtensionNumbers(extendee->full_name(),
                                                    &numbers)) {
      for (int i = 0; i < numbers.size(); ++i) {
        int number = numbers[i];
        if (tables_->FindExtension(extendee, number) == NULL) {
          TryFindExtensionInFallbackDatabase(extendee, number);
        }
      }
      tables_->extensions_loaded_from_db_.insert(extendee);
    }
  }

  tables_->FindAllExtensions(extendee, out);
  if (underlay_ != NULL) {
    underlay_->FindAllExtensions(extendee, out);
  }
}